

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractscrollarea.cpp
# Opt level: O0

void __thiscall
QAbstractScrollAreaScrollBarContainer::QAbstractScrollAreaScrollBarContainer
          (QAbstractScrollAreaScrollBarContainer *this,Orientation orientation,QWidget *parent)

{
  long lVar1;
  QMargins *margins;
  QWidget *parent_00;
  QMargins *in_RDX;
  undefined4 in_ESI;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  QWidget *in_stack_ffffffffffffff78;
  QWidget *in_stack_ffffffffffffff88;
  QFlagsStorage<Qt::AlignmentFlag> alignment;
  QWidget *in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffff98;
  QFlagsStorage<Qt::WindowType> f;
  QScrollBar *in_stack_ffffffffffffffa0;
  QLayout *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 uVar2;
  
  f.i = (Int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QFlags<Qt::WindowType>::QFlags((QFlags<Qt::WindowType> *)0x494d90);
  QWidget::QWidget(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,(WindowFlags)f.i);
  *in_RDI = &PTR_metaObject_00d0b8e8;
  in_RDI[2] = &PTR__QAbstractScrollAreaScrollBarContainer_00d0ba98;
  margins = (QMargins *)operator_new(0x28);
  QScrollBar::QScrollBar(in_stack_ffffffffffffffa0,f.i,in_stack_ffffffffffffff90);
  in_RDI[5] = margins;
  parent_00 = (QWidget *)operator_new(0x20);
  uVar2 = 0;
  QBoxLayout::QBoxLayout((QBoxLayout *)in_stack_ffffffffffffffa0,f.i,parent_00);
  in_RDI[6] = parent_00;
  *(undefined4 *)(in_RDI + 7) = in_ESI;
  QWidget::setLayout((QWidget *)CONCAT44(uVar2,in_stack_ffffffffffffffb8),in_stack_ffffffffffffffb0)
  ;
  QMargins::QMargins(in_RDX);
  QLayout::setContentsMargins((QLayout *)parent_00,margins);
  alignment.i = (Int)((ulong)margins >> 0x20);
  (**(code **)(*(long *)in_RDI[6] + 0x68))((long *)in_RDI[6],uVar2);
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x494ea2);
  QBoxLayout::addWidget((QBoxLayout *)in_RDX,in_stack_ffffffffffffff78,0,(Alignment)alignment.i);
  QLayout::setSizeConstraint((QLayout *)parent_00,alignment.i);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QAbstractScrollAreaScrollBarContainer::QAbstractScrollAreaScrollBarContainer(Qt::Orientation orientation, QWidget *parent)
    :QWidget(parent), scrollBar(new QScrollBar(orientation, this)),
     layout(new QBoxLayout(orientation == Qt::Horizontal ? QBoxLayout::LeftToRight : QBoxLayout::TopToBottom)),
     orientation(orientation)
{
    setLayout(layout);
    layout->setContentsMargins(QMargins());
    layout->setSpacing(0);
    layout->addWidget(scrollBar);
    layout->setSizeConstraint(QLayout::SetMaximumSize);
}